

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR xpath_true(lyxp_set **UNUSED_args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined4 uVar4;
  
  if ((options & 0x1c) == 0) {
    lyxp_set_free_content(set);
    set->type = LYXP_SET_BOOLEAN;
    (set->val).bln = '\x01';
  }
  else {
    uVar1 = set->used;
    if ((ulong)uVar1 != 0) {
      lVar3 = 0;
      do {
        iVar2 = *(int *)((long)&((set->val).nodes)->pos + lVar3);
        uVar4 = 0;
        if (iVar2 == 2) {
LAB_001b0224:
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar3) = uVar4;
        }
        else if (iVar2 == -2) {
          uVar4 = 0xffffffff;
          goto LAB_001b0224;
        }
        lVar3 = lVar3 + 0x18;
      } while ((ulong)uVar1 * 0x18 != lVar3);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_true(struct lyxp_set **UNUSED(args), uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    if (options & LYXP_SCNODE_ALL) {
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_NODE);
        return LY_SUCCESS;
    }

    set_fill_boolean(set, 1);
    return LY_SUCCESS;
}